

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O2

int __thiscall tcu::DebugOutStreambuf::overflow(DebugOutStreambuf *this,int ch)

{
  int iVar1;
  long lVar2;
  char chVal;
  
  if (ch != -1) {
    chVal = (char)ch;
    lVar2 = (**(code **)(*(long *)this + 0x60))(this,&chVal,1);
    iVar1 = -1;
    if (lVar2 == 1) {
      iVar1 = ch;
    }
    return iVar1;
  }
  return -1;
}

Assistant:

int DebugOutStreambuf::overflow (int ch)
{
	if (ch == -1)
		return -1;
	else
	{
		DE_ASSERT((ch & 0xff) == ch);
		const char chVal = (char)(deUint8)(ch & 0xff);
		return xsputn(&chVal, 1) == 1 ? ch : -1;
	}
}